

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::emit_resources(CompilerGLSL *this)

{
  uint32_t *ts_2;
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  *this_00;
  Variant *this_01;
  int iVar1;
  ID id;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  size_t sVar4;
  CompilerGLSL *this_02;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  uint uVar8;
  StorageClass SVar9;
  ExecutionModel EVar10;
  SPIREntryPoint *pSVar11;
  ulong uVar12;
  SPIRConstant *pSVar13;
  SPIRUndef *pSVar14;
  SPIRType *pSVar15;
  SPIRConstantOp *constant;
  uint *puVar16;
  SPIRVariable *pSVar17;
  mapped_type *pmVar18;
  string *psVar19;
  CompilerError *this_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  ID *__k;
  BaseType BVar21;
  CompilerGLSL *pCVar22;
  byte bVar23;
  long lVar24;
  bool emitted;
  CompilerGLSL *local_1b8;
  bool emitted_base_instance;
  TypedID<(spirv_cross::Types)0> *local_1a8;
  SPIREntryPoint *local_1a0;
  string local_198;
  SpecializationConstant wg_x;
  SpecializationConstant wg_z;
  char *storage;
  size_type local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [16];
  
  pSVar11 = Compiler::get_entry_point(&this->super_Compiler);
  (*(this->super_Compiler)._vptr_Compiler[0x3d])(this);
  if ((pSVar11->model == ExecutionModelFragment) && (bVar5 = is_legacy(this), bVar5)) {
    replace_fragment_outputs(this);
  }
  if (((this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->pls_inputs).
       super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
       super__Vector_impl_data._M_finish) ||
     ((this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->pls_outputs).
      super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    emit_pls(this);
  }
  EVar10 = pSVar11->model;
  if ((EVar10 - ExecutionModelTessellationControl < 3) || (EVar10 == ExecutionModelMeshEXT)) {
    fixup_implicit_builtin_block_names(this,EVar10);
  }
  if ((this->super_Compiler).position_invariant == true) {
    bVar5 = true;
    if ((this->options).es == false) {
      bVar5 = 0x77 < (this->options).version;
    }
  }
  else {
    bVar5 = false;
  }
  local_1a0 = pSVar11;
  if (((this->options).separate_shader_objects == true) && ((this->options).es == false)) {
    EVar10 = pSVar11->model;
    if (EVar10 - ExecutionModelTessellationControl < 3) {
      emit_declared_builtin_block(this,Input,EVar10);
      goto LAB_0027aaaf;
    }
    if (EVar10 != ExecutionModelVertex) {
      if (EVar10 == ExecutionModelFragment) goto LAB_0027a9b0;
      if (EVar10 != ExecutionModelMeshEXT) goto LAB_0027aade;
    }
  }
  else {
LAB_0027a9b0:
    bVar6 = should_force_emit_builtin_block(this,Output);
    if (!bVar6) {
      if (pSVar11->geometry_passthrough == true) {
        emit_declared_builtin_block(this,Input,pSVar11->model);
      }
      else {
        storage = "out";
        if (pSVar11->model == ExecutionModelFragment) {
          storage = "in";
        }
        ts_2 = &(this->super_Compiler).clip_distance_count;
        if ((this->super_Compiler).clip_distance_count != 0) {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,&storage,(char (*) [24])0x34a7b1,ts_2,(char (*) [3])0x32f1f7);
        }
        if ((this->super_Compiler).cull_distance_count == 0) {
          bVar6 = true;
        }
        else {
          statement<char_const*&,char_const(&)[24],unsigned_int&,char_const(&)[3]>
                    (this,&storage,(char (*) [24])0x34a7ca,
                     &(this->super_Compiler).cull_distance_count,(char (*) [3])0x32f1f7);
          bVar6 = (this->super_Compiler).cull_distance_count == 0;
        }
        if ((*ts_2 != 0) || (!bVar6)) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x2fba29);
        }
      }
LAB_0027aade:
      if (bVar5) {
        statement<char_const(&)[23]>(this,(char (*) [23])"invariant gl_Position;");
        statement<char_const(&)[1]>(this,(char (*) [1])0x2fba29);
      }
      goto LAB_0027ab01;
    }
LAB_0027aaaf:
    EVar10 = pSVar11->model;
  }
  emit_declared_builtin_block(this,Output,EVar10);
LAB_0027ab01:
  emitted = false;
  local_1b8 = (CompilerGLSL *)&(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock((ParsedIR *)local_1b8);
  local_1a8 = (this->super_Compiler).ir.ids_for_constant_undef_or_type.
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_constant_undef_or_type.
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar24 = 0; sVar2 << 2 != lVar24; lVar24 = lVar24 + 4) {
    uVar12 = (ulong)*(uint *)((long)&local_1a8->id + lVar24);
    pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
    this_01 = (Variant *)(&pbVar20->_M_dataplus + uVar12 * 3);
    iVar1 = *(int *)((long)&pbVar20->field_2 + uVar12 * 0x18);
    if (iVar1 == 1) {
      pSVar15 = Variant::get<spirv_cross::SPIRType>(this_01);
      if (pSVar15->basetype == Struct) {
        if ((((pSVar15->array).super_VectorView<unsigned_int>.buffer_size != 0) ||
            (pSVar15->pointer != false)) ||
           (bVar5 = Compiler::has_decoration
                              (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,Block),
           bVar5)) {
          bVar5 = false;
        }
        else {
          bVar5 = Compiler::has_decoration
                            (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,BufferBlock
                            );
          bVar5 = !bVar5;
        }
        if (((pSVar15->basetype == Struct) && (pSVar15->pointer == true)) &&
           ((bVar6 = Compiler::has_decoration
                               (&this->super_Compiler,(ID)(pSVar15->super_IVariant).self.id,Block),
            bVar6 && ((uVar8 = pSVar15->storage - RayPayloadKHR, uVar8 < 5 &&
                      ((0x13U >> (uVar8 & 0x1f) & 1) != 0)))))) {
          pSVar15 = Compiler::get<spirv_cross::SPIRType>
                              (&this->super_Compiler,(pSVar15->parent_type).id);
        }
        else if (!bVar5) goto LAB_0027adf5;
        if (emitted == true) {
          statement<char_const(&)[1]>(this,(char (*) [1])0x2fba29);
        }
        emitted = false;
        emit_struct(this,pSVar15);
      }
    }
    else if (iVar1 == 0xc) {
      pSVar14 = Variant::get<spirv_cross::SPIRUndef>(this_01);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar14->super_IVariant).field_0xc);
      if ((pSVar15->basetype != Void) &&
         (bVar5 = Compiler::type_is_top_level_block(&this->super_Compiler,pSVar15), !bVar5)) {
        storage = (char *)local_138;
        local_140 = 0;
        local_138[0]._M_allocated_capacity = local_138[0]._M_allocated_capacity & 0xffffffffffffff00
        ;
        if (((this->options).force_zero_initialized_variables == true) &&
           (bVar5 = type_can_zero_initialize(this,pSVar15), bVar5)) {
          (*(this->super_Compiler)._vptr_Compiler[0x3b])
                    (&wg_x,this,(ulong)*(uint *)&(pSVar14->super_IVariant).field_0xc);
          join<char_const(&)[4],std::__cxx11::string>
                    (&local_198,(spirv_cross *)0x34513c,(char (*) [4])&wg_x,pbVar20);
          ::std::__cxx11::string::operator=((string *)&storage,(string *)&local_198);
          ::std::__cxx11::string::~string((string *)&local_198);
          ::std::__cxx11::string::~string((string *)&wg_x);
        }
        (*(this->super_Compiler)._vptr_Compiler[6])
                  (&wg_x,this,(ulong)(pSVar14->super_IVariant).self.id,1);
        (*(this->super_Compiler)._vptr_Compiler[0x1b])
                  (&local_198,this,pSVar15,&wg_x,(ulong)(pSVar14->super_IVariant).self.id);
        statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                  (this,&local_198,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&storage,
                   (char (*) [2])0x344fd0);
        ::std::__cxx11::string::~string((string *)&local_198);
        ::std::__cxx11::string::~string((string *)&wg_x);
        emitted = true;
        ::std::__cxx11::string::~string((string *)&storage);
      }
    }
    else if (iVar1 == 9) {
      constant = Variant::get<spirv_cross::SPIRConstantOp>(this_01);
      emit_specialization_constant_op(this,constant);
LAB_0027ad36:
      emitted = true;
    }
    else if (iVar1 == 3) {
      pSVar13 = Variant::get<spirv_cross::SPIRConstant>(this_01);
      if ((pSVar13->specialization != false) || ((pSVar13->is_used_as_lut & 1U) != 0)) {
        if ((pSVar13->specialization != false) && ((this->options).vulkan_semantics == false)) {
          id.id = (pSVar13->super_IVariant).self.id;
          pCVar22 = (CompilerGLSL *)(ulong)id.id;
          uVar7 = Compiler::get_decoration(&this->super_Compiler,id,DecorationSpecId);
          constant_value_macro_name_abi_cxx11_((string *)&storage,pCVar22,uVar7);
          ::std::__cxx11::string::operator=
                    ((string *)&pSVar13->specialization_constant_macro_name,(string *)&storage);
          ::std::__cxx11::string::~string((string *)&storage);
        }
        emit_constant(this,pSVar13);
        goto LAB_0027ad36;
      }
    }
LAB_0027adf5:
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&emitted_base_instance);
  if (emitted != false) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x2fba29);
  }
  if (((local_1a0->model == ExecutionModelGLCompute) && ((this->options).vulkan_semantics == false))
     && (((local_1a0->workgroup_size).constant != 0 ||
         (((local_1a0->flags).lower & 0x4000000000) != 0)))) {
    wg_x = (SpecializationConstant)((ulong)wg_x & 0xffffffff00000000);
    _emitted_base_instance = 0;
    wg_z.id.id = 0;
    Compiler::get_work_group_size_specialization_constants
              (&this->super_Compiler,&wg_x,(SpecializationConstant *)&emitted_base_instance,&wg_z);
    if (((wg_x.id.id != 0) || (_emitted_base_instance != 0)) || (wg_z.id.id != 0)) {
      storage = local_138[0]._M_local_buf + 8;
      local_140 = 0;
      local_138[0]._M_allocated_capacity = 8;
      build_workgroup_size
                (this,(SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                       *)&storage,&wg_x,(SpecializationConstant *)&emitted_base_instance,&wg_z);
      merge(&local_198,
            (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)&storage,", ");
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[6]>
                (this,(char (*) [8])"layout(",&local_198,(char (*) [6])0x348d19);
      ::std::__cxx11::string::~string((string *)&local_198);
      statement<char_const(&)[1]>(this,(char (*) [1])0x2fba29);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)&storage);
    }
  }
  emitted = false;
  if ((this->super_Compiler).ir.addressing_model == AddressingModelPhysicalStorageBuffer64) {
    ParsedIR::create_loop_hard_lock((ParsedIR *)local_1b8);
    pTVar3 = (this->super_Compiler).ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    sVar2 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    for (lVar24 = 0; sVar2 << 2 != lVar24; lVar24 = lVar24 + 4) {
      uVar8 = *(uint *)((long)&pTVar3->id + lVar24);
      if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar8].type ==
          TypeType) {
        pSVar15 = ParsedIR::get<spirv_cross::SPIRType>((ParsedIR *)local_1b8,uVar8);
        local_198._M_dataplus._M_p._0_4_ = uVar8;
        bVar5 = Compiler::is_physical_pointer(&this->super_Compiler,pSVar15);
        if (bVar5) {
          bVar5 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar15);
          if (!bVar5) {
            puVar16 = (this->super_Compiler).physical_storage_non_block_pointer_types.
                      super_VectorView<unsigned_int>.ptr;
            puVar16 = ::std::
                      __find_if<unsigned_int*,__gnu_cxx::__ops::_Iter_equals_val<unsigned_int_const>>
                                (puVar16,puVar16 + (this->super_Compiler).
                                                   physical_storage_non_block_pointer_types.
                                                   super_VectorView<unsigned_int>.buffer_size,
                                 &local_198);
            if (puVar16 ==
                (this->super_Compiler).physical_storage_non_block_pointer_types.
                super_VectorView<unsigned_int>.ptr +
                (this->super_Compiler).physical_storage_non_block_pointer_types.
                super_VectorView<unsigned_int>.buffer_size) goto LAB_0027b00d;
            uVar8 = (uint)local_198._M_dataplus._M_p;
          }
          emit_buffer_reference_block(this,uVar8,true);
        }
      }
LAB_0027b00d:
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
    puVar16 = (this->super_Compiler).physical_storage_non_block_pointer_types.
              super_VectorView<unsigned_int>.ptr;
    sVar2 = (this->super_Compiler).physical_storage_non_block_pointer_types.
            super_VectorView<unsigned_int>.buffer_size;
    for (lVar24 = 0; sVar2 << 2 != lVar24; lVar24 = lVar24 + 4) {
      emit_buffer_reference_block(this,*(uint32_t *)((long)puVar16 + lVar24),false);
    }
    ParsedIR::create_loop_hard_lock((ParsedIR *)local_1b8);
    pTVar3 = (this->super_Compiler).ir.ids_for_type[1].
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    sVar2 = (this->super_Compiler).ir.ids_for_type[1].
            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
    for (lVar24 = 0; sVar2 << 2 != lVar24; lVar24 = lVar24 + 4) {
      uVar8 = *(uint *)((long)&pTVar3->id + lVar24);
      if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar8].type ==
          TypeType) {
        pSVar15 = ParsedIR::get<spirv_cross::SPIRType>((ParsedIR *)local_1b8,uVar8);
        bVar5 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSVar15);
        if (bVar5) {
          emit_buffer_reference_block(this,uVar8,false);
        }
      }
    }
    ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
  }
  ParsedIR::create_loop_hard_lock((ParsedIR *)local_1b8);
  local_1a0 = (SPIREntryPoint *)
              (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  this_00 = &(this->super_Compiler).ir.meta;
  local_1a8 = (TypedID<(spirv_cross::Types)0> *)
              ((this->super_Compiler).ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size << 2);
  for (lVar24 = 0; local_1a8 != (TypedID<(spirv_cross::Types)0> *)lVar24; lVar24 = lVar24 + 4) {
    uVar8 = *(uint *)((long)&local_1a0->self + lVar24);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar8].type ==
        TypeVariable) {
      pSVar17 = ParsedIR::get<spirv_cross::SPIRVariable>((ParsedIR *)local_1b8,uVar8);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar17->super_IVariant).field_0xc);
      SVar9 = pSVar15->storage;
      bVar23 = 1;
      if (((SVar9 != StorageClassUniform) && (SVar9 != StorageBuffer)) &&
         (SVar9 != ShaderRecordBufferKHR)) {
        bVar23 = 0;
      }
      __k = &(pSVar15->super_IVariant).self;
      pmVar18 = ::std::__detail::
                _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,__k);
      if (((pmVar18->decoration).decoration_flags.lower & 4) == 0) {
        pmVar18 = ::std::__detail::
                  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)this_00,__k);
        bVar5 = ((pmVar18->decoration).decoration_flags.lower & 8) == 0;
      }
      else {
        bVar5 = false;
      }
      if (((pSVar17->storage != Function) && ((bVar23 & pSVar15->pointer) != 0)) &&
         (bVar6 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,false),
         !bVar5 && !bVar6)) {
        (*(this->super_Compiler)._vptr_Compiler[0x21])(this,pSVar17);
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
  ParsedIR::create_loop_hard_lock((ParsedIR *)local_1b8);
  pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar24 = 0; sVar2 << 2 != lVar24; lVar24 = lVar24 + 4) {
    uVar8 = *(uint *)((long)&pTVar3->id + lVar24);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar8].type ==
        TypeVariable) {
      pSVar17 = ParsedIR::get<spirv_cross::SPIRVariable>((ParsedIR *)local_1b8,uVar8);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar17->super_IVariant).field_0xc);
      if ((((pSVar17->storage != Function) && (pSVar15->pointer == true)) &&
          (pSVar15->storage == PushConstant)) &&
         (bVar5 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,false), !bVar5)) {
        (*(this->super_Compiler)._vptr_Compiler[0x22])(this,pSVar17);
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
  sVar2 = (this->super_Compiler).combined_image_samplers.
          super_VectorView<spirv_cross::CombinedImageSampler>.buffer_size;
  bVar5 = (this->options).vulkan_semantics;
  ParsedIR::create_loop_hard_lock((ParsedIR *)local_1b8);
  pTVar3 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar4 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  for (lVar24 = 0; sVar4 << 2 != lVar24; lVar24 = lVar24 + 4) {
    uVar8 = *(uint *)((long)&pTVar3->id + lVar24);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar8].type ==
        TypeVariable) {
      pSVar17 = ParsedIR::get<spirv_cross::SPIRVariable>((ParsedIR *)local_1b8,uVar8);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar17->super_IVariant).field_0xc);
      if ((((bVar5 & sVar2 == 0) != 0) ||
          (BVar21 = pSVar15->basetype ^ Image,
          (pSVar15->image).dim == Buffer && BVar21 == Unknown ||
          pSVar15->basetype != Sampler && ((pSVar15->image).sampled != 1 || BVar21 != Unknown))) &&
         ((pSVar17->storage != Function && (pSVar15->pointer == true)))) {
        SVar9 = pSVar15->storage;
        if ((((SVar9 - CallableDataKHR < 0xf) &&
             ((0x4c03U >> (SVar9 - CallableDataKHR & 0x1f) & 1) != 0)) ||
            ((SVar9 == AtomicCounter || (SVar9 == StorageClassUniformConstant)))) &&
           (bVar6 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,false), !bVar6)) {
          (*(this->super_Compiler)._vptr_Compiler[0x23])(this,pSVar17);
          emitted = true;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
  if (emitted == true) {
    statement<char_const(&)[1]>(this,(char (*) [1])0x2fba29);
  }
  lVar24 = 0;
  local_198._M_dataplus._M_p = &emitted;
  emitted = false;
  _emitted_base_instance = _emitted_base_instance & 0xffffff00;
  wg_x = (SpecializationConstant)&emitted_base_instance;
  ParsedIR::create_loop_hard_lock((ParsedIR *)local_1b8);
  local_1a8 = (this->super_Compiler).ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  do {
    if (sVar2 << 2 == lVar24) {
      ParsedIR::LoopLock::~LoopLock((LoopLock *)&storage);
      local_1a0 = (SPIREntryPoint *)
                  (this->super_Compiler).global_variables.super_VectorView<unsigned_int>.ptr;
      local_1a8 = (TypedID<(spirv_cross::Types)0> *)
                  ((this->super_Compiler).global_variables.super_VectorView<unsigned_int>.
                   buffer_size << 2);
      local_1b8 = this;
      for (lVar24 = 0; pCVar22 = local_1b8, local_1a8 != (TypedID<(spirv_cross::Types)0> *)lVar24;
          lVar24 = lVar24 + 4) {
        pSVar17 = Compiler::get<spirv_cross::SPIRVariable>
                            (&local_1b8->super_Compiler,*(uint32_t *)((long)local_1a0 + lVar24));
        bVar5 = Compiler::is_hidden_variable(&pCVar22->super_Compiler,pSVar17,true);
        if (!bVar5) {
          if (pSVar17->storage == Output) {
            uVar7 = (pSVar17->initializer).id;
            if ((uVar7 != 0) &&
               (pSVar13 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                                    (&local_1b8->super_Compiler,uVar7),
               pSVar13 != (SPIRConstant *)0x0)) {
              emit_output_variable_initializer(local_1b8,pSVar17);
            }
          }
          else {
            bVar5 = variable_is_lut(local_1b8,pSVar17);
            pCVar22 = local_1b8;
            if (!bVar5) {
              add_resource_name(local_1b8,(pSVar17->super_IVariant).self.id);
              this_02 = local_1b8;
              storage = (char *)local_138;
              local_140 = 0;
              local_138[0]._M_allocated_capacity =
                   local_138[0]._M_allocated_capacity & 0xffffffffffffff00;
              if (((((pCVar22->options).force_zero_initialized_variables == true) &&
                   (pSVar17->storage == Private)) && ((pSVar17->initializer).id == 0)) &&
                 ((pSVar17->static_expression).id == 0)) {
                pSVar15 = Compiler::get_variable_data_type(&local_1b8->super_Compiler,pSVar17);
                bVar5 = type_can_zero_initialize(this_02,pSVar15);
                pCVar22 = local_1b8;
                if (bVar5) {
                  uVar7 = Compiler::get_variable_data_type_id(&local_1b8->super_Compiler,pSVar17);
                  pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (pCVar22->super_Compiler)._vptr_Compiler;
                  (**(code **)((long)&pbVar20[0xe].field_2 + 8))(&wg_x,pCVar22,uVar7);
                  join<char_const(&)[4],std::__cxx11::string>
                            (&local_198,(spirv_cross *)0x34513c,(char (*) [4])&wg_x,pbVar20);
                  ::std::__cxx11::string::operator=((string *)&storage,(string *)&local_198);
                  ::std::__cxx11::string::~string((string *)&local_198);
                  ::std::__cxx11::string::~string((string *)&wg_x);
                }
              }
              pCVar22 = local_1b8;
              (*(local_1b8->super_Compiler)._vptr_Compiler[0x28])(&local_198,local_1b8,pSVar17);
              statement<std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                        (pCVar22,&local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &storage,(char (*) [2])0x344fd0);
              ::std::__cxx11::string::~string((string *)&local_198);
              emitted = true;
              ::std::__cxx11::string::~string((string *)&storage);
            }
          }
        }
      }
      if (emitted != false) {
        statement<char_const(&)[1]>(local_1b8,(char (*) [1])0x2fba29);
      }
      return;
    }
    uVar8 = *(uint *)((long)&local_1a8->id + lVar24);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar8].type ==
        TypeVariable) {
      pSVar17 = ParsedIR::get<spirv_cross::SPIRVariable>((ParsedIR *)local_1b8,uVar8);
      pSVar15 = Compiler::get<spirv_cross::SPIRType>
                          (&this->super_Compiler,*(uint32_t *)&(pSVar17->super_IVariant).field_0xc);
      bVar5 = Compiler::is_hidden_variable(&this->super_Compiler,pSVar17,false);
      SVar9 = pSVar17->storage;
      if (SVar9 == Output) {
        bVar6 = is_legacy(this);
        if (!bVar6) {
          uVar7 = Compiler::get_decoration
                            (&this->super_Compiler,(ID)(pSVar17->super_IVariant).self.id,
                             DecorationLocation);
          bVar6 = location_is_framebuffer_fetch(this,uVar7);
          bVar5 = bVar5 && !bVar6;
        }
        SVar9 = pSVar17->storage;
      }
      if (((SVar9 == Function) || (pSVar15->pointer != true)) ||
         (((SVar9 | StorageClassUniform) != Output ||
          (bVar6 = Compiler::interface_variable_exists_in_entry_point
                             (&this->super_Compiler,(pSVar17->super_IVariant).self.id),
          bVar5 != false || !bVar6)))) {
        bVar5 = Compiler::is_builtin_variable(&this->super_Compiler,pSVar17);
        if ((bVar5) &&
           (uVar7 = Compiler::get_decoration
                              (&this->super_Compiler,(ID)(pSVar17->super_IVariant).self.id,BuiltIn),
           (this->options).vulkan_semantics == false)) {
          if ((emitted_base_instance == false) &&
             ((uVar7 == 0x1149 ||
              ((uVar7 == 0x2b & (this->options).vertex.support_nonzero_base_instance) != 0)))) {
            statement<char_const(&)[37]>(this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters")
            ;
            statement<char_const(&)[52]>
                      (this,(char (*) [52])"#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[38]>
                      (this,(char (*) [38])"uniform int SPIRV_Cross_BaseInstance;");
            statement<char_const(&)[7]>(this,(char (*) [7])0x2fbd0b);
            emitted = true;
            psVar19 = (string *)&wg_x;
            goto LAB_0027b619;
          }
          if (uVar7 == 0x114a) {
            statement<char_const(&)[38]>
                      (this,(char (*) [38])"#ifndef GL_ARB_shader_draw_parameters");
            statement<char_const(&)[55]>
                      (this,(char (*) [55])"#error GL_ARB_shader_draw_parameters is not supported.")
            ;
          }
          else {
            if (uVar7 != 0x1148) goto LAB_0027b61f;
            statement<char_const(&)[37]>(this,(char (*) [37])"#ifdef GL_ARB_shader_draw_parameters")
            ;
            statement<char_const(&)[48]>
                      (this,(char (*) [48])"#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
            statement<char_const(&)[6]>(this,(char (*) [6])"#else");
            statement<char_const(&)[36]>(this,(char (*) [36])"uniform int SPIRV_Cross_BaseVertex;");
          }
          statement<char_const(&)[7]>(this,(char (*) [7])0x2fbd0b);
        }
      }
      else {
        if (((((this->options).es == true) &&
             (EVar10 = Compiler::get_execution_model(&this->super_Compiler),
             EVar10 == ExecutionModelVertex)) && (pSVar17->storage == Input)) &&
           ((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 1)) {
          this_03 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (this_03,"OpenGL ES doesn\'t support array input variables in vertex shader.");
          __cxa_throw(this_03,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        emit_interface_block(this,pSVar17);
        psVar19 = &local_198;
LAB_0027b619:
        *(psVar19->_M_dataplus)._M_p = '\x01';
      }
    }
LAB_0027b61f:
    lVar24 = lVar24 + 4;
  } while( true );
}

Assistant:

void CompilerGLSL::emit_resources()
{
	auto &execution = get_entry_point();

	replace_illegal_names();

	// Legacy GL uses gl_FragData[], redeclare all fragment outputs
	// with builtins.
	if (execution.model == ExecutionModelFragment && is_legacy())
		replace_fragment_outputs();

	// Emit PLS blocks if we have such variables.
	if (!pls_inputs.empty() || !pls_outputs.empty())
		emit_pls();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelMeshEXT:
		fixup_implicit_builtin_block_names(execution.model);
		break;

	default:
		break;
	}

	bool global_invariant_position = position_invariant && (options.es || options.version >= 120);

	// Emit custom gl_PerVertex for SSO compatibility.
	if (options.separate_shader_objects && !options.es && execution.model != ExecutionModelFragment)
	{
		switch (execution.model)
		{
		case ExecutionModelGeometry:
		case ExecutionModelTessellationControl:
		case ExecutionModelTessellationEvaluation:
			emit_declared_builtin_block(StorageClassInput, execution.model);
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			global_invariant_position = false;
			break;

		case ExecutionModelVertex:
		case ExecutionModelMeshEXT:
			emit_declared_builtin_block(StorageClassOutput, execution.model);
			global_invariant_position = false;
			break;

		default:
			break;
		}
	}
	else if (should_force_emit_builtin_block(StorageClassOutput))
	{
		emit_declared_builtin_block(StorageClassOutput, execution.model);
		global_invariant_position = false;
	}
	else if (execution.geometry_passthrough)
	{
		// Need to declare gl_in with Passthrough.
		// If we're doing passthrough, we cannot emit an output block, so the output block test above will never pass.
		emit_declared_builtin_block(StorageClassInput, execution.model);
	}
	else
	{
		// Need to redeclare clip/cull distance with explicit size to use them.
		// SPIR-V mandates these builtins have a size declared.
		const char *storage = execution.model == ExecutionModelFragment ? "in" : "out";
		if (clip_distance_count != 0)
			statement(storage, " float gl_ClipDistance[", clip_distance_count, "];");
		if (cull_distance_count != 0)
			statement(storage, " float gl_CullDistance[", cull_distance_count, "];");
		if (clip_distance_count != 0 || cull_distance_count != 0)
			statement("");
	}

	if (global_invariant_position)
	{
		statement("invariant gl_Position;");
		statement("");
	}

	bool emitted = false;

	// If emitted Vulkan GLSL,
	// emit specialization constants as actual floats,
	// spec op expressions will redirect to the constant name.
	//
	{
		auto loop_lock = ir.create_loop_hard_lock();
		for (auto &id_ : ir.ids_for_constant_undef_or_type)
		{
			auto &id = ir.ids[id_];

			// Skip declaring any bogus constants or undefs which use block types.
			// We don't declare block types directly, so this will never work.
			// Should not be legal SPIR-V, so this is considered a workaround.

			if (id.get_type() == TypeConstant)
			{
				auto &c = id.get<SPIRConstant>();

				bool needs_declaration = c.specialization || c.is_used_as_lut;

				if (needs_declaration)
				{
					if (!options.vulkan_semantics && c.specialization)
					{
						c.specialization_constant_macro_name =
						    constant_value_macro_name(get_decoration(c.self, DecorationSpecId));
					}
					emit_constant(c);
					emitted = true;
				}
			}
			else if (id.get_type() == TypeConstantOp)
			{
				emit_specialization_constant_op(id.get<SPIRConstantOp>());
				emitted = true;
			}
			else if (id.get_type() == TypeType)
			{
				auto *type = &id.get<SPIRType>();

				bool is_natural_struct = type->basetype == SPIRType::Struct && type->array.empty() && !type->pointer &&
				                         (!has_decoration(type->self, DecorationBlock) &&
				                          !has_decoration(type->self, DecorationBufferBlock));

				// Special case, ray payload and hit attribute blocks are not really blocks, just regular structs.
				if (type->basetype == SPIRType::Struct && type->pointer &&
				    has_decoration(type->self, DecorationBlock) &&
				    (type->storage == StorageClassRayPayloadKHR || type->storage == StorageClassIncomingRayPayloadKHR ||
				     type->storage == StorageClassHitAttributeKHR))
				{
					type = &get<SPIRType>(type->parent_type);
					is_natural_struct = true;
				}

				if (is_natural_struct)
				{
					if (emitted)
						statement("");
					emitted = false;

					emit_struct(*type);
				}
			}
			else if (id.get_type() == TypeUndef)
			{
				auto &undef = id.get<SPIRUndef>();
				auto &type = this->get<SPIRType>(undef.basetype);
				// OpUndef can be void for some reason ...
				if (type.basetype == SPIRType::Void)
					continue;

				// This will break. It is bogus and should not be legal.
				if (type_is_top_level_block(type))
					continue;

				string initializer;
				if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
					initializer = join(" = ", to_zero_initialized_expression(undef.basetype));

				// FIXME: If used in a constant, we must declare it as one.
				statement(variable_decl(type, to_name(undef.self), undef.self), initializer, ";");
				emitted = true;
			}
		}
	}

	if (emitted)
		statement("");

	// If we needed to declare work group size late, check here.
	// If the work group size depends on a specialization constant, we need to declare the layout() block
	// after constants (and their macros) have been declared.
	if (execution.model == ExecutionModelGLCompute && !options.vulkan_semantics &&
	    (execution.workgroup_size.constant != 0 || execution.flags.get(ExecutionModeLocalSizeId)))
	{
		SpecializationConstant wg_x, wg_y, wg_z;
		get_work_group_size_specialization_constants(wg_x, wg_y, wg_z);

		if ((wg_x.id != ConstantID(0)) || (wg_y.id != ConstantID(0)) || (wg_z.id != ConstantID(0)))
		{
			SmallVector<string> inputs;
			build_workgroup_size(inputs, wg_x, wg_y, wg_z);
			statement("layout(", merge(inputs), ") in;");
			statement("");
		}
	}

	emitted = false;

	if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
	{
		// Output buffer reference blocks.
		// Do this in two stages, one with forward declaration,
		// and one without. Buffer reference blocks can reference themselves
		// to support things like linked lists.
		ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
			if (is_physical_pointer(type))
			{
				bool emit_type = true;
				if (!is_physical_pointer_to_buffer_block(type))
				{
					// Only forward-declare if we intend to emit it in the non_block_pointer types.
					// Otherwise, these are just "benign" pointer types that exist as a result of access chains.
					emit_type = std::find(physical_storage_non_block_pointer_types.begin(),
					                      physical_storage_non_block_pointer_types.end(),
					                      id) != physical_storage_non_block_pointer_types.end();
				}

				if (emit_type)
					emit_buffer_reference_block(id, true);
			}
		});

		for (auto type : physical_storage_non_block_pointer_types)
			emit_buffer_reference_block(type, false);

		ir.for_each_typed_id<SPIRType>([&](uint32_t id, SPIRType &type) {
			if (is_physical_pointer_to_buffer_block(type))
				emit_buffer_reference_block(id, false);
		});
	}

	// Output UBOs and SSBOs
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_block_storage = type.storage == StorageClassStorageBuffer || type.storage == StorageClassUniform ||
		                        type.storage == StorageClassShaderRecordBufferKHR;
		bool has_block_flags = ir.meta[type.self].decoration.decoration_flags.get(DecorationBlock) ||
		                       ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);

		if (var.storage != StorageClassFunction && type.pointer && is_block_storage && !is_hidden_variable(var) &&
		    has_block_flags)
		{
			emit_buffer_block(var);
		}
	});

	// Output push constant blocks
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		if (var.storage != StorageClassFunction && type.pointer && type.storage == StorageClassPushConstant &&
		    !is_hidden_variable(var))
		{
			emit_push_constant_block(var);
		}
	});

	bool skip_separate_image_sampler = !combined_image_samplers.empty() || !options.vulkan_semantics;

	// Output Uniform Constants (values, samplers, images, etc).
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		// If we're remapping separate samplers and images, only emit the combined samplers.
		if (skip_separate_image_sampler)
		{
			// Sampler buffers are always used without a sampler, and they will also work in regular GL.
			bool sampler_buffer = type.basetype == SPIRType::Image && type.image.dim == DimBuffer;
			bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
			bool separate_sampler = type.basetype == SPIRType::Sampler;
			if (!sampler_buffer && (separate_image || separate_sampler))
				return;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (type.storage == StorageClassUniformConstant || type.storage == StorageClassAtomicCounter ||
		     type.storage == StorageClassRayPayloadKHR || type.storage == StorageClassIncomingRayPayloadKHR ||
		     type.storage == StorageClassCallableDataKHR || type.storage == StorageClassIncomingCallableDataKHR ||
		     type.storage == StorageClassHitAttributeKHR) &&
		    !is_hidden_variable(var))
		{
			emit_uniform(var);
			emitted = true;
		}
	});

	if (emitted)
		statement("");
	emitted = false;

	bool emitted_base_instance = false;

	// Output in/out interfaces.
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);

		bool is_hidden = is_hidden_variable(var);

		// Unused output I/O variables might still be required to implement framebuffer fetch.
		if (var.storage == StorageClassOutput && !is_legacy() &&
		    location_is_framebuffer_fetch(get_decoration(var.self, DecorationLocation)) != 0)
		{
			is_hidden = false;
		}

		if (var.storage != StorageClassFunction && type.pointer &&
		    (var.storage == StorageClassInput || var.storage == StorageClassOutput) &&
		    interface_variable_exists_in_entry_point(var.self) && !is_hidden)
		{
			if (options.es && get_execution_model() == ExecutionModelVertex && var.storage == StorageClassInput &&
			    type.array.size() == 1)
			{
				SPIRV_CROSS_THROW("OpenGL ES doesn't support array input variables in vertex shader.");
			}
			emit_interface_block(var);
			emitted = true;
		}
		else if (is_builtin_variable(var))
		{
			auto builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			// For gl_InstanceIndex emulation on GLES, the API user needs to
			// supply this uniform.

			// The draw parameter extension is soft-enabled on GL with some fallbacks.
			if (!options.vulkan_semantics)
			{
				if (!emitted_base_instance &&
				    ((options.vertex.support_nonzero_base_instance && builtin == BuiltInInstanceIndex) ||
				     (builtin == BuiltInBaseInstance)))
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseInstance gl_BaseInstanceARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseInstance;");
					statement("#endif");
					emitted = true;
					emitted_base_instance = true;
				}
				else if (builtin == BuiltInBaseVertex)
				{
					statement("#ifdef GL_ARB_shader_draw_parameters");
					statement("#define SPIRV_Cross_BaseVertex gl_BaseVertexARB");
					statement("#else");
					// A crude, but simple workaround which should be good enough for non-indirect draws.
					statement("uniform int SPIRV_Cross_BaseVertex;");
					statement("#endif");
				}
				else if (builtin == BuiltInDrawIndex)
				{
					statement("#ifndef GL_ARB_shader_draw_parameters");
					// Cannot really be worked around.
					statement("#error GL_ARB_shader_draw_parameters is not supported.");
					statement("#endif");
				}
			}
		}
	});

	// Global variables.
	for (auto global : global_variables)
	{
		auto &var = get<SPIRVariable>(global);
		if (is_hidden_variable(var, true))
			continue;

		if (var.storage != StorageClassOutput)
		{
			if (!variable_is_lut(var))
			{
				add_resource_name(var.self);

				string initializer;
				if (options.force_zero_initialized_variables && var.storage == StorageClassPrivate &&
				    !var.initializer && !var.static_expression && type_can_zero_initialize(get_variable_data_type(var)))
				{
					initializer = join(" = ", to_zero_initialized_expression(get_variable_data_type_id(var)));
				}

				statement(variable_decl(var), initializer, ";");
				emitted = true;
			}
		}
		else if (var.initializer && maybe_get<SPIRConstant>(var.initializer) != nullptr)
		{
			emit_output_variable_initializer(var);
		}
	}

	if (emitted)
		statement("");
}